

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

int __thiscall
capnp::_::OrphanBuilder::copy(OrphanBuilder *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  StructReader value;
  SegmentAnd<capnp::word_*> SVar1;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  undefined8 in_stack_00000028;
  undefined8 in_stack_00000030;
  
  this->capTable = (CapTableBuilder *)0x0;
  this->location = (word *)0x0;
  (this->tag).content = 0;
  this->segment = (SegmentBuilder *)0x0;
  value.capTable = (CapTableReader *)in_stack_00000010;
  value.segment = (SegmentReader *)in_stack_00000008;
  value.data = (void *)in_stack_00000018;
  value.pointers = (WirePointer *)in_stack_00000020;
  value._32_8_ = in_stack_00000028;
  value._40_8_ = in_stack_00000030;
  SVar1 = WireHelpers::setStructPointer
                    ((SegmentBuilder *)0x0,(CapTableBuilder *)src,(WirePointer *)this,value,
                     (BuilderArena *)dst,false);
  this->segment = SVar1.segment;
  this->capTable = (CapTableBuilder *)src;
  this->location = SVar1.value;
  return (int)this;
}

Assistant:

OrphanBuilder OrphanBuilder::copy(
    BuilderArena* arena, CapTableBuilder* capTable, StructReader copyFrom) {
  OrphanBuilder result;
  auto allocation = WireHelpers::setStructPointer(
      nullptr, capTable, result.tagAsPtr(), copyFrom, arena);
  result.segment = allocation.segment;
  result.capTable = capTable;
  result.location = reinterpret_cast<word*>(allocation.value);
  return result;
}